

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_ReadNL_Test::TestBody(ProblemTest_ReadNL_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int in_R9D;
  AssertHelper local_370;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    mp::ReadNLFile<mp::BasicProblem<mp::BasicProblemParams<int>>>((CStringRef)0x15798b,&p,0);
  }
  testing::Message::Message((Message *)&local_368);
  testing::internal::AssertHelper::AssertHelper
            (&local_370,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",0x25
             ,
             "Expected: ReadNLFile(\"nonexistent\", p) throws an exception of type fmt::SystemError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
  testing::internal::AssertHelper::~AssertHelper(&local_370);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_368);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &p;
    mp::ReadNLString<mp::BasicProblem<mp::BasicProblemParams<int>>>
              ((mp *)0x15d600,(NLStringRef)(auVar1 << 0x40),
               (BasicProblem<mp::BasicProblemParams<int>_> *)"(input)",(CStringRef)0x0,in_R9D);
  }
  testing::Message::Message((Message *)&local_368);
  testing::internal::AssertHelper::AssertHelper
            (&local_370,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",0x26
             ,
             "Expected: ReadNLString(\"\", p) throws an exception of type mp::Error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
  testing::internal::AssertHelper::~AssertHelper(&local_370);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_368);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, ReadNL) {
  mp::Problem p;
  // Just make sure that ReadNLFile and ReadNLString are accessible.
  // They are tested elsewhere.
  EXPECT_THROW(ReadNLFile("nonexistent", p), fmt::SystemError);
  EXPECT_THROW(ReadNLString("", p), mp::Error);
}